

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 getSafetyLevel(char *z,int omitFull,u8 dflt)

{
  int iVar1;
  uint N;
  int iVar2;
  u8 in_DL;
  int in_ESI;
  byte *in_RDI;
  int n;
  int i;
  char *in_stack_ffffffffffffffd8;
  u8 local_1;
  
  if ((""[*in_RDI] & 4) == 0) {
    N = sqlite3Strlen30(in_stack_ffffffffffffffd8);
    for (iVar1 = 0; local_1 = in_DL, iVar1 < 8; iVar1 = iVar1 + 1) {
      if ((("\x02\x02\x03\x05\x03\x04\x05\x04"[iVar1] == N) &&
          (iVar2 = sqlite3_strnicmp("onoffalseyestruextrafull" + ""[iVar1],(char *)in_RDI,N),
          iVar2 == 0)) && ((in_ESI == 0 || ("\x01"[iVar1] < 2)))) {
        return "\x01"[iVar1];
      }
    }
  }
  else {
    iVar1 = sqlite3Atoi(&DAT_aaaaaaaaaaaaaaaa);
    local_1 = (u8)iVar1;
  }
  return local_1;
}

Assistant:

static u8 getSafetyLevel(const char *z, int omitFull, u8 dflt){
                             /* 123456789 123456789 123 */
  static const char zText[] = "onoffalseyestruextrafull";
  static const u8 iOffset[] = {0, 1, 2,  4,    9,  12,  15,   20};
  static const u8 iLength[] = {2, 2, 3,  5,    3,   4,   5,    4};
  static const u8 iValue[] =  {1, 0, 0,  0,    1,   1,   3,    2};
                            /* on no off false yes true extra full */
  int i, n;
  if( sqlite3Isdigit(*z) ){
    return (u8)sqlite3Atoi(z);
  }
  n = sqlite3Strlen30(z);
  for(i=0; i<ArraySize(iLength); i++){
    if( iLength[i]==n && sqlite3StrNICmp(&zText[iOffset[i]],z,n)==0
     && (!omitFull || iValue[i]<=1)
    ){
      return iValue[i];
    }
  }
  return dflt;
}